

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O3

_Bool Curl_conn_is_tcp_listen(Curl_easy *data,int sockindex)

{
  Curl_cfilter *pCVar1;
  bool bVar2;
  
  pCVar1 = data->conn->cfilter[sockindex];
  if (pCVar1 == (Curl_cfilter *)0x0) {
    return false;
  }
  do {
    bVar2 = pCVar1->cft == &Curl_cft_tcp_accept;
    if (bVar2) {
      return bVar2;
    }
    pCVar1 = pCVar1->next;
  } while (pCVar1 != (Curl_cfilter *)0x0);
  return bVar2;
}

Assistant:

bool Curl_conn_is_tcp_listen(struct Curl_easy *data,
                             int sockindex)
{
  struct Curl_cfilter *cf = data->conn->cfilter[sockindex];
  while(cf) {
    if(cf->cft == &Curl_cft_tcp_accept)
      return TRUE;
    cf = cf->next;
  }
  return FALSE;
}